

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O2

bool BDVFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  bool bVar2;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd:1.3?,r?-=bb",&local_79)
  ;
  bVar1 = find_str_in_buf(&local_38,buf);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"<<format.asc>>",&local_7a);
    bVar1 = find_str_in_buf(&local_58,buf);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"<<pins.asc>>",&local_7b);
      bVar2 = find_str_in_buf(&local_78,buf);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool BDVFile::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("dd:1.3?,r?-=bb", buf) ||
	       (find_str_in_buf("<<format.asc>>", buf) && find_str_in_buf("<<pins.asc>>", buf));
}